

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int new_socket(uv_tcp_t *handle,int domain,uint flags)

{
  int fd;
  int iVar1;
  
  fd = uv__socket(domain,1,0);
  iVar1 = fd;
  if (-1 < fd) {
    iVar1 = uv__stream_open((uv_stream_t *)handle,fd,flags);
    if (iVar1 == 0) {
      iVar1 = 0;
      if ((flags >> 0xd & 1) != 0) {
        iVar1 = maybe_bind_socket(fd);
        return iVar1;
      }
    }
    else {
      uv__close(fd);
    }
  }
  return iVar1;
}

Assistant:

static int new_socket(uv_tcp_t* handle, int domain, unsigned int flags) {
  int sockfd;
  int err;

  sockfd = uv__socket(domain, SOCK_STREAM, 0);
  if (sockfd < 0)
    return sockfd;

  err = uv__stream_open((uv_stream_t*) handle, sockfd, flags);
  if (err) {
    uv__close(sockfd);
    return err;
  }

  if (flags & UV_HANDLE_BOUND)
    return maybe_bind_socket(sockfd);

  return 0;
}